

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

String * __thiscall
cm::String::replace(String *this,const_iterator first,const_iterator last,size_type count2,char ch)

{
  type pSVar1;
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_48);
  std::__cxx11::string::append<char_const*,void>((string *)&local_48,(this->view_)._M_str,first);
  std::__cxx11::string::append((ulong)&local_48,(char)count2);
  std::__cxx11::string::append<char_const*,void>
            ((string *)&local_48,last,(this->view_)._M_str + (this->view_)._M_len);
  pSVar1 = operator=(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return pSVar1;
}

Assistant:

String& replace(const_iterator first, const_iterator last, size_type count2,
                  char ch)
  {
    std::string out;
    out.reserve((first - this->view_.begin()) + count2 +
                (this->view_.end() - last));
    out.append(this->view_.begin(), first);
    out.append(count2, ch);
    out.append(last, this->view_.end());
    return *this = std::move(out);
  }